

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O1

void TypeCheck_Block(KonohaContext *kctx,KonohaStack *sfp)

{
  ktypeattr_t kVar1;
  int iVar2;
  kNameSpace *block;
  KClass *pKVar3;
  _func_void_char_ptr_char_ptr_int_char_ptr_varargs *p_Var4;
  size_t sVar5;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var6;
  kString *pkVar7;
  uintptr_t uVar8;
  kNameSpace *pkVar9;
  kNameSpace *pkVar10;
  kNameSpace *pkVar11;
  undefined4 uVar12;
  kNameSpace *n;
  kNameSpace *pkVar13;
  
  block = (kNameSpace *)sfp[1].field_0.asNode;
  pKVar3 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
  pkVar13 = block;
  do {
    pkVar10 = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar13->importedNameSpaceList)->
              StmtNameSpace;
    if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar13->importedNameSpaceList)->StmtNameSpace
        ->h).ct == pKVar3) break;
    pkVar13 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar13->packageId)->RootNodeNameSpace;
    pkVar10 = pkVar13;
  } while ((pkVar13->h).ct != pKVar3);
  pKVar3 = ((sfp[3].field_0.asObject)->h).ct;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_Block",0x6d,"tracing..");
  pkVar13 = (kNameSpace *)0xffffffff;
  if (((block->importedNameSpaceList->h).ct)->baseTypeId == 6) {
    pkVar13 = (kNameSpace *)(ulong)((int)(block->importedNameSpaceList->bytesize >> 3) - 1);
  }
  kVar1 = pKVar3->typeId;
  (*kctx->klib->DumpObject)
            (kctx,(kObject_conflict *)block,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
             ,"TypeCheckBlock",0xf6);
  p_Var4 = (kctx->platApi->ConsoleModule).ReportDebugMessage;
  sVar5 = (pkVar10->genv->localScope).varsize;
  pkVar7 = (*kctx->klib->KClass_shortName)(kctx,pKVar3);
  p_Var6 = ((pkVar7->h).ct)->unbox;
  pkVar7 = (*kctx->klib->KClass_shortName)(kctx,pKVar3);
  uVar8 = (*p_Var6)(kctx,(kObject_conflict *)pkVar7);
  (*p_Var4)("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
            ,"TypeCheckBlock",0xf7,">>>>>>>> size=%d, varsize=%d, reqc=%s",pkVar13,sVar5,uVar8);
  pkVar11 = pkVar13;
  if (0 < (int)pkVar13) {
    n = (kNameSpace *)0x0;
    do {
      pkVar9 = (kNameSpace *)
               TypeCheckNodeList(kctx,(kNode *)block,(size_t)n,pkVar10,
                                 *(kctx->share->classTable).field_1.classItems);
      iVar2 = *(int *)&pkVar9->parentNULL;
      if (((iVar2 == 0x18) && (pkVar11 = pkVar9, kVar1 == 0)) &&
         (pkVar11 = block, *(int *)&block->parentNULL != 0x18)) {
        block->parentNULL = (kNameSpace *)0xd;
      }
      if (iVar2 == 0x18) goto LAB_00114fff;
      n = (kNameSpace *)((long)&(n->h).magicflag + 1);
    } while (pkVar13 != n);
  }
  if ((int)pkVar13 < 0) {
    if (*(int *)&block->parentNULL != 0x18) {
      block->parentNULL = (kNameSpace *)0xd;
    }
  }
  else {
    pkVar10 = (kNameSpace *)TypeCheckNodeList(kctx,(kNode *)block,(size_t)pkVar13,pkVar10,pKVar3);
    iVar2 = *(int *)&pkVar10->parentNULL;
    if (iVar2 == 0x18) {
      pkVar11 = pkVar10;
      if ((kVar1 == 0) && (uVar12 = 0, pkVar11 = block, *(int *)&block->parentNULL != 0x18)) {
LAB_00114f7f:
        *(undefined4 *)&block->parentNULL = 0xd;
        *(undefined4 *)((long)&block->parentNULL + 4) = uVar12;
      }
    }
    else if (*(int *)&block->parentNULL != 0x18) {
      uVar12 = *(undefined4 *)((long)&pkVar10->parentNULL + 4);
      goto LAB_00114f7f;
    }
    if (iVar2 == 0x18) goto LAB_00114fff;
  }
  p_Var4 = (kctx->platApi->ConsoleModule).ReportDebugMessage;
  pkVar7 = KType_GetString(kctx,*(uint *)((long)&block->parentNULL + 4) & 0xfffffff);
  p_Var6 = ((pkVar7->h).ct)->unbox;
  pkVar7 = KType_GetString(kctx,*(uint *)((long)&block->parentNULL + 4) & 0xfffffff);
  uVar8 = (*p_Var6)(kctx,(kObject_conflict *)pkVar7);
  (*p_Var4)("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
            ,"TypeCheckBlock",0x109,">>>>>>>> size=%d, typed=%s",pkVar13,uVar8);
  pkVar11 = block;
LAB_00114fff:
  sfp[-4].field_0.dummy_intValue = (kint_t)pkVar11;
  (*kctx->klib->CheckSafePoint)(kctx,sfp,0);
  return;
}

Assistant:

static KMETHOD TypeCheck_Block(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck2(stmt, expr, ns, reqc);
	KReturn(TypeCheckBlock(kctx, expr, ns, reqc));
}